

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,uchar c)

{
  uchar *puVar1;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
  (this->super_tagbstring).mlen = 2;
  (this->super_tagbstring).slen = 1;
  puVar1 = (uchar *)malloc(2);
  (this->super_tagbstring).data = puVar1;
  if (puVar1 != (uchar *)0x0) {
    *puVar1 = c;
    puVar1[1] = '\0';
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Failure in (char) constructor","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (unsigned char c) {
	mlen = 2;
	slen = 1;
	if (NULL == (data = (unsigned char *) bstr__alloc (mlen))) {
		mlen = slen = 0;
		bstringThrow ("Failure in (char) constructor");
	} else {
		data[0] = c;
		data[1] = '\0';
	}
}